

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O0

void __thiscall
stateObservation::ZeroDelayObserver::pushMeasurement(ZeroDelayObserver *this,MeasureVector *y_k)

{
  bool bVar1;
  uint uVar2;
  TimeSize TVar3;
  TimeIndex TVar4;
  MeasureVector *y_k_local;
  ZeroDelayObserver *this_local;
  
  uVar2 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x18])(this,y_k);
  if ((uVar2 & 1) == 0) {
    __assert_fail("checkMeasureVector(y_k) && \"The size of the measure vector is incorrect\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x43,
                  "virtual void stateObservation::ZeroDelayObserver::pushMeasurement(const ObserverBase::MeasureVector &)"
                 );
  }
  TVar3 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::size(&this->y_);
  if (TVar3 < 1) {
    bVar1 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::isSet(&this->x_);
    if (!bVar1) {
      __assert_fail("x_.isSet() && \"Unable to initialize measurement without time index, the state vector has not been set.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                    ,0x4b,
                    "virtual void stateObservation::ZeroDelayObserver::pushMeasurement(const ObserverBase::MeasureVector &)"
                   );
    }
    TVar4 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::getTime(&this->x_);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::setValue(&this->y_,y_k,TVar4 + 1);
  }
  else {
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::pushBack(&this->y_,y_k);
  }
  return;
}

Assistant:

void ZeroDelayObserver::pushMeasurement(const ObserverBase::MeasureVector & y_k)
{

  BOOST_ASSERT(checkMeasureVector(y_k) && "The size of the measure vector is incorrect");
  if(y_.size() > 0)
  {
    y_.pushBack(y_k);
  }
  else
  {
    BOOST_ASSERT(x_.isSet()
                 && "Unable to initialize measurement without time index, the state vector has not been set.");
    /// we need the measurement of the next state to correct for the prediction
    y_.setValue(y_k, x_.getTime() + 1);
  }
}